

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

void draw_left_arrow(int left,int top,int width,int height,Am_Widget_Look look,bool depressed,
                    bool active,Computed_Colors_Record *color_rec,Am_Drawonable *draw)

{
  Am_Style *prev;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  am_rect arrow_rect;
  Am_Style fill1;
  Am_Style line2;
  Am_Style line1;
  
  if (look.value == Am_MACINTOSH_LOOK_val) {
    arrow_rect.width = width;
    arrow_rect.height = height;
    arrow_rect.left = left;
    arrow_rect.top = top;
    draw_mac_arrow_box(arrow_rect,active,color_rec,draw);
    if (active) {
      if (depressed) {
        prev = &Am_Black;
      }
      else {
        prev = &color_rec->data->background_style;
      }
    }
    else {
      prev = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&fill1,prev);
    uVar1 = left + 8;
    uVar3 = (ulong)uVar1;
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,uVar3,(ulong)(top + 2),(ulong)uVar1,
               (ulong)(top + 0xc),(ulong)(left + 3),(ulong)(top + 7),uVar3,(ulong)(top + 2),0);
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,uVar3,(ulong)(top + 5),(ulong)(left + 0xc)
               ,(ulong)(top + 5),(ulong)(left + 0xc),(ulong)(top + 9),uVar3,(ulong)(top + 9),0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&fill1,(ulong)uVar1,(ulong)(top + 6),(ulong)uVar1,(ulong)(top + 8),0);
  }
  else {
    if (look.value == Am_WINDOWS_LOOK_val) {
      iVar5 = 0;
      draw_win_arrow_box((am_rect)CONCAT88(CONCAT44(height,width),CONCAT44(top,left)),depressed,
                         false,color_rec,draw);
      uVar4 = (uint)depressed + left + 5;
      uVar2 = (uint)depressed + top + 7;
      uVar1 = uVar2;
      do {
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&Am_Black,(ulong)uVar4,(ulong)(uVar2 + iVar5),(ulong)uVar4,(ulong)uVar1,0);
        iVar5 = iVar5 + -1;
        uVar4 = uVar4 + 1;
        uVar1 = uVar1 + 1;
      } while (iVar5 != -4);
      return;
    }
    if (look.value != Am_MOTIF_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    Am_Style::Am_Style(&fill1,&color_rec->data->foreground_style + depressed);
    Am_Style::Am_Style(&line1,&color_rec->data->shadow_style + depressed);
    Am_Style::Am_Style(&line2,&color_rec->data->shadow_style + !depressed);
    uVar4 = (width + left) - 2;
    uVar1 = top + 1 + ((height - (height + -2 >> 0x1f)) + -2 >> 1);
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&Am_No_Style,(ulong)(uint)left,(ulong)uVar1,(ulong)uVar4,
               (ulong)(uint)(height + -1 + top),(ulong)uVar4,(ulong)(top + 1),0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&line2,(ulong)(uint)left,(ulong)uVar1,(ulong)uVar4,(ulong)(top + 1),0);
    uVar4 = (width + left) - 3;
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&fill1,(ulong)(left + 1U),(ulong)uVar1,(ulong)uVar4,
               (ulong)((top + height) - 2),(ulong)uVar4,(ulong)(top + 2),0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&line2,(ulong)(left + 1U),(ulong)uVar1,(ulong)uVar4,(ulong)(top + 2),0);
    Am_Style::~Am_Style(&line2);
    Am_Style::~Am_Style(&line1);
  }
  Am_Style::~Am_Style(&fill1);
  return;
}

Assistant:

void
draw_left_arrow(int left, int top, int width, int height, Am_Widget_Look look,
                bool depressed, bool active,
                const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  am_rect arrow_rect(left, top, width, height);
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    const Am_Style fill1(depressed ? color_rec.data->background_style
                                   : color_rec.data->foreground_style);
    const Am_Style line1(depressed ? color_rec.data->highlight_style
                                   : color_rec.data->shadow_style);
    const Am_Style line2(depressed ? color_rec.data->shadow_style
                                   : color_rec.data->highlight_style);

    int center_y = top + (height - 2) / 2;
    int rightm1 = left + width - 2;
    int bottomm1 = top + height - 2;

    //bottom line
    draw->Draw_2_Lines(line1, Am_No_Style, left, center_y + 1, rightm1,
                       bottomm1 + 1, rightm1, top + 1);
    //top line
    draw->Draw_Line(line2, left, center_y + 1, rightm1, top + 1);
    //bottom line
    draw->Draw_2_Lines(line1, fill1, left + 1, center_y + 1, rightm1 - 1,
                       bottomm1, rightm1 - 1, top + 2);
    //top line
    draw->Draw_Line(line2, left + 1, center_y + 1, rightm1 - 1, top + 2);
    break;
  }

  case Am_WINDOWS_LOOK_val: {
    draw_win_arrow_box(arrow_rect, depressed, false, color_rec, draw);

    int a_top = !depressed ? 7 : 8, a_left = !depressed ? 5 : 6, a_width = 4,
        a_height = 0; // actually 1, because of pixel drawing

    for (int x = 0; x < a_width; x++) {
      draw->Draw_Line(Am_Black, left + a_left + x, top + a_top,
                      left + a_left + x, top + a_top + a_height);
      a_top--;
      a_height += 2;
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    draw_mac_arrow_box(arrow_rect, active, color_rec, draw);

    Am_Style fill_style =
        (active) ? (!depressed ? color_rec.data->background_style : Am_Black)
                 : color_rec.data->foreground_style;
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 8,
                       top + 2, left + 8, top + 12, left + 3, top + 7, left + 8,
                       top + 2);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 8,
                       top + 5, left + 12, top + 5, left + 12, top + 9,
                       left + 8, top + 9);
    draw->Draw_Line(fill_style, left + 8, top + 6, left + 8, top + 8);
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}